

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  Type result_type;
  int line_number;
  Type TVar1;
  AssertHelperData *pAVar2;
  char *file_name;
  string local_78;
  string local_58;
  allocator<char> local_31;
  
  UnitTest::GetInstance();
  pAVar2 = this->data_;
  result_type = pAVar2->type;
  file_name = pAVar2->file;
  line_number = pAVar2->line;
  AppendUserMessage(&local_78,&pAVar2->message,message);
  TVar1 = this->data_->type;
  if ((TVar1 == kSuccess) || (TVar1 == kSkip)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_31);
  }
  else {
    UnitTest::GetInstance();
    UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
              (&local_58,UnitTest::GetInstance::instance.impl_,1);
  }
  UnitTest::AddTestPartResult
            (&UnitTest::GetInstance::instance,result_type,file_name,line_number,&local_78,&local_58)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->AddTestPartResult(
      data_->type, data_->file, data_->line,
      AppendUserMessage(data_->message, message),
      ShouldEmitStackTraceForResultType(data_->type)
          ? UnitTest::GetInstance()->impl()->CurrentOsStackTraceExceptTop(1)
          : ""
      // Skips the stack frame for this function itself.
  );  // NOLINT
}